

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.cpp
# Opt level: O1

void test2K(void)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  HaarWavelet w2;
  HaarWavelet wavelet;
  Mat dst1;
  Mat m;
  Mat dst;
  _InputOutputArray local_1a0;
  HaarWavelet local_188;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined1 local_168 [3] [32];
  _InputArray local_108;
  Mat local_f0 [96];
  _InputArray local_90;
  Mat local_78 [96];
  
  cv::Mat::Mat(local_f0,0x5a0,0xa00,0x10);
  cv::Mat::Mat(local_78);
  local_1a0.super__OutputArray.super__InputArray.sz.width = 0;
  local_1a0.super__OutputArray.super__InputArray.sz.height = 0;
  local_1a0.super__OutputArray.super__InputArray.flags = 0x3010000;
  local_108.obj = local_168;
  local_168[0] = ZEXT432(0) << 0x40;
  local_108.flags = -0x3efdfffa;
  local_108.sz.width = 1;
  local_108.sz.height = 4;
  local_90.obj = &local_188;
  local_188.super_Wavelet._vptr_Wavelet = (_func_int **)0x406fe00000000000;
  local_188.pImpl = (HaarWavelet *)0x406fe00000000000;
  uStack_178 = 0x406fe00000000000;
  uStack_170 = 0;
  local_90.flags = -0x3efdfffa;
  local_90.sz.width = 1;
  local_90.sz.height = 4;
  local_1a0.super__OutputArray.super__InputArray.obj = local_f0;
  cv::randu(&local_1a0,&local_108,&local_90);
  imagestego::HaarWavelet::HaarWavelet(&local_188);
  lVar1 = std::chrono::_V2::system_clock::now();
  imagestego::HaarWavelet::transform((HaarWavelet *)local_168,(Mat *)&local_188);
  cv::Mat::operator=(local_78,(Mat *)local_168);
  cv::Mat::~Mat((Mat *)local_168);
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ns",3);
  local_168[0][0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_168,1);
  imagestego::experimental::HaarWavelet::HaarWavelet((HaarWavelet *)&local_1a0);
  lVar4 = std::chrono::_V2::system_clock::now();
  imagestego::experimental::HaarWavelet::transform((HaarWavelet *)local_168,(Mat *)&local_1a0);
  lVar5 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ns",3);
  local_108.flags = CONCAT31(local_108.flags._1_3_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_108,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Total speedup is: ",0x12);
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) / (double)(lVar5 - lVar4));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  cv::Mat::~Mat((Mat *)local_168);
  imagestego::experimental::HaarWavelet::~HaarWavelet((HaarWavelet *)&local_1a0);
  imagestego::HaarWavelet::~HaarWavelet(&local_188);
  cv::Mat::~Mat(local_78);
  cv::Mat::~Mat(local_f0);
  return;
}

Assistant:

void test2K() {
    cv::Mat m(1440, 2560, CV_8UC3), dst;
    cv::randu(m, cv::Scalar(0, 0, 0), cv::Scalar(255, 255, 255));
    imagestego::HaarWavelet wavelet;
    // start
    auto start = chrono::high_resolution_clock::now();
    dst = wavelet.transform(m);
    auto end = chrono::high_resolution_clock::now();
    // end
    chrono::nanoseconds ns = end - start;
    std::cout << ns.count() << " ns" << '\n';

    imagestego::experimental::HaarWavelet w2;

    start = chrono::high_resolution_clock::now();
    cv::Mat dst1 = w2.transform(m);
    end = chrono::high_resolution_clock::now();
    chrono::nanoseconds ns1 = end - start;
    std::cout << ns1.count() << " ns" << '\n';

    std::cout << "Total speedup is: " << double(ns.count()) / ns1.count() << std::endl;
}